

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O3

int publickey_response_success(LIBSSH2_PUBLICKEY *pkey)

{
  LIBSSH2_SESSION *session;
  uchar *puVar1;
  int iVar2;
  uint32_t uVar3;
  ulong uVar4;
  char *pcVar5;
  uchar *s;
  uchar *data;
  size_t data_len;
  uchar *local_48;
  uchar *local_40;
  ulong local_38;
  
  session = pkey->channel->session;
  do {
    iVar2 = publickey_packet_receive(pkey,&local_40,&local_38);
    uVar4 = local_38;
    puVar1 = local_40;
    if (iVar2 != 0) {
      if (iVar2 == -0x25) {
        return -0x25;
      }
      pcVar5 = "Timeout waiting for response from publickey subsystem";
      iVar2 = -0x1e;
LAB_00120832:
      iVar2 = _libssh2_error(session,iVar2,pcVar5);
      return iVar2;
    }
    if (local_38 < 4) {
LAB_00120812:
      pcVar5 = "Publickey response too small";
      iVar2 = -0x26;
      goto LAB_00120832;
    }
    local_48 = local_40;
    iVar2 = publickey_response_id(&local_48,local_38);
    if (iVar2 == 0) {
      if (7 < uVar4) {
        uVar3 = _libssh2_ntohu32(local_48);
        (*session->free)(puVar1,&session->abstract);
        if (uVar3 == 0) {
          return 0;
        }
        if (uVar3 == 6) {
          uVar4 = (ulong)(pkey->version == 1) | 6;
        }
        else {
          if (8 < uVar3) {
            pcVar5 = "unknown";
            goto LAB_00120892;
          }
          uVar4 = (ulong)uVar3;
        }
        pcVar5 = publickey_status_codes[uVar4].name;
LAB_00120892:
        _libssh2_error(session,-0x24,pcVar5);
        return -1;
      }
      goto LAB_00120812;
    }
    (*session->free)(puVar1,&session->abstract);
    if (iVar2 < 0) {
      pcVar5 = "Invalid publickey subsystem response";
      iVar2 = -0x24;
      goto LAB_00120832;
    }
    _libssh2_error(session,-0x24,"Unexpected publickey subsystem response");
    local_40 = (uchar *)0x0;
  } while( true );
}

Assistant:

static int
publickey_response_success(LIBSSH2_PUBLICKEY * pkey)
{
    LIBSSH2_SESSION *session = pkey->channel->session;
    unsigned char *data, *s;
    size_t data_len;
    int response;

    for(;;) {
        int rc = publickey_packet_receive(pkey, &data, &data_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_TIMEOUT,
                                  "Timeout waiting for response from "
                                  "publickey subsystem");
        }

        if(data_len < 4) {
            return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                  "Publickey response too small");
        }

        s = data;
        response = publickey_response_id(&s, data_len);

        switch(response) {
        case LIBSSH2_PUBLICKEY_RESPONSE_STATUS:
            /* Error, or processing complete */
        {
            unsigned long status = 0;

            if(data_len < 8) {
                return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                      "Publickey response too small");
            }

            status = _libssh2_ntohu32(s);

            LIBSSH2_FREE(session, data);

            if(status == LIBSSH2_PUBLICKEY_SUCCESS)
                return 0;

            publickey_status_error(pkey, session, status);
            goto err_exit;
        }
        default:
            LIBSSH2_FREE(session, data);
            if(response < 0) {
                return _libssh2_error(session,
                                      LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                                      "Invalid publickey subsystem response");
            }
            /* Unknown/Unexpected */
            _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                           "Unexpected publickey subsystem response");
            data = NULL;
        }
    }
err_exit:
    return -1;
}